

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testSpecDowngradefp16(void)

{
  int iVar1;
  bool bVar2;
  int32 iVar3;
  ModelDescription *pMVar4;
  FeatureType *pFVar5;
  WeightParams *pWVar6;
  ostream *poVar7;
  Model *this;
  undefined1 local_130 [8];
  Model mlmodel;
  undefined1 local_110 [8];
  Result res;
  string local_e0;
  int local_c0;
  allocator<char> local_b9;
  int i_1;
  int local_98;
  int local_94;
  int i;
  int num_weights;
  ConvolutionLayerParams *params;
  NeuralNetworkLayer *convLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  int nGroups;
  int kernel_width;
  int kernel_height;
  int kernel_channels;
  int output_channels;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::Specification::Model::set_specificationversion((Model *)local_40,7);
  kernel_height = 5;
  kernel_width = 3;
  nGroups = 2;
  topIn._4_4_ = 5;
  topIn._0_4_ = 1;
  pMVar4 = CoreML::Specification::Model::mutable_description((Model *)local_40);
  shape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_input(pMVar4);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)shape,"input");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)shape);
  out3 = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,100);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,100);
  pMVar4 = CoreML::Specification::Model::mutable_description((Model *)local_40);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar4);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"probs");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  convLayer = (NeuralNetworkLayer *)
              CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
  params = (ConvolutionLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)convLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"probs");
  _i = CoreML::Specification::NeuralNetworkLayer::mutable_convolution((NeuralNetworkLayer *)params);
  CoreML::Specification::ConvolutionLayerParams::set_outputchannels(_i,5);
  CoreML::Specification::ConvolutionLayerParams::set_kernelchannels(_i,3);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(_i,(long)nGroups);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(_i,(long)topIn._4_4_);
  CoreML::Specification::ConvolutionLayerParams::set_hasbias(_i,true);
  CoreML::Specification::ConvolutionLayerParams::mutable_valid(_i);
  local_94 = kernel_height * (kernel_width / (int)topIn) * nGroups * topIn._4_4_;
  for (local_98 = 0; local_98 < local_94; local_98 = local_98 + 1) {
    pWVar6 = CoreML::Specification::ConvolutionLayerParams::mutable_weights(_i);
    iVar1 = local_94 * 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,(long)iVar1,'a',&local_b9);
    CoreML::Specification::WeightParams::set_float16value(pWVar6,(string *)&i_1);
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator(&local_b9);
  }
  for (local_c0 = 0; local_c0 < kernel_height; local_c0 = local_c0 + 1) {
    pWVar6 = CoreML::Specification::ConvolutionLayerParams::mutable_bias(_i);
    iVar1 = kernel_height * 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,(long)iVar1,'b',
               (allocator<char> *)(res.m_message.field_2._M_local_buf + 0xf));
    CoreML::Specification::WeightParams::set_float16value(pWVar6,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)(res.m_message.field_2._M_local_buf + 0xf));
  }
  CoreML::validate<(MLModelType)500>((Result *)local_110,(Model *)local_40);
  bVar2 = CoreML::Result::good((Result *)local_110);
  if (bVar2) {
    CoreML::Model::Model((Model *)local_130,(Model *)local_40);
    this = CoreML::Model::getProto((Model *)local_130);
    iVar3 = CoreML::Specification::Model::specificationversion(this);
    if (iVar3 != 2) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1029);
      poVar7 = std::operator<<(poVar7,": error: ");
      poVar7 = std::operator<<(poVar7,
                               "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2"
                              );
      poVar7 = std::operator<<(poVar7," was false, expected true.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    m1._oneof_case_[0]._1_3_ = 0;
    m1._oneof_case_[0]._0_1_ = iVar3 != 2;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
    CoreML::Model::~Model((Model *)local_130);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1025);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"(res).good()");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
  }
  CoreML::Result::~Result((Result *)local_110);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testSpecDowngradefp16() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION);

    int output_channels = 5;
    int kernel_channels = 3;
    int kernel_height = 2;
    int kernel_width = 5;
    int nGroups = 1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);
    params->add_kernelsize(kernel_height);
    params->add_kernelsize(kernel_width);

    params->set_hasbias(true);

    (void)params->mutable_valid();

    int num_weights = output_channels * (kernel_channels / nGroups) * kernel_height * kernel_width;
    for (int i = 0; i < num_weights; i++) {
        params->mutable_weights()->set_float16value(std::string(num_weights*2, 'a'));
    }

    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->set_float16value(std::string(output_channels*2, 'b'));
    }

    // Not specifying the right number of weights should be invalid
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2);

    return 0;

}